

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int setup_decode_folder(archive_read *a,_7z_folder *folder,int header)

{
  _7zip *zip;
  ulong uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  uint64_t uVar6;
  size_t *psVar7;
  size_t __n;
  uchar *puVar8;
  _7z_coder *coder2;
  int iVar9;
  char *fmt;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  _7z_coder *p_Var13;
  long lVar14;
  char *pcVar15;
  _7z_coder *coder1;
  uchar *b [3];
  int idx [3];
  void *buff;
  size_t s [3];
  _7z_coder *scoder [3];
  void *local_d8 [3];
  _7z_coder *local_c0;
  int local_b8 [4];
  _7z_coder *local_a8;
  archive_read *local_a0;
  _7z_coder *local_98;
  void *local_90;
  size_t local_88 [4];
  undefined8 local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  _7z_coder *local_48 [3];
  
  zip = (_7zip *)a->format->data;
  lVar14 = 0x9be;
  do {
    free((void *)(&(zip->si).pi.pos)[lVar14]);
    (&(zip->si).pi.pos)[lVar14] = 0;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x9c1);
  pcVar15 = "archive header";
  if (header == 0) {
    pcVar15 = "file content";
  }
  uVar10 = (uint)folder->numPackedStreams;
  zip->pack_stream_remaining = uVar10;
  zip->pack_stream_index = folder->packIndex;
  uVar6 = folder_uncompressed_size(folder);
  zip->folder_outbytes_remaining = uVar6;
  zip->uncompressed_buffer_bytes_remaining = 0;
  uVar1 = folder->numCoders;
  if (uVar1 == 0) {
    iVar9 = 0;
  }
  else {
    uVar12 = 0;
    uVar11 = 1;
    iVar9 = 0;
    do {
      uVar2 = folder->coders[uVar12].codec;
      if ((long)uVar2 < 0x6f10101) {
        if (uVar2 == 0x303011b) {
          iVar9 = iVar9 + 1;
        }
      }
      else if (((uVar2 == 0x6f10101) || (uVar2 == 0x6f10701)) || (uVar2 == 0x6f10303)) {
        zip->has_encrypted_entries = 1;
        if (a->entry != (archive_entry *)0x0) {
          archive_entry_set_is_data_encrypted(a->entry,'\x01');
          archive_entry_set_is_metadata_encrypted(a->entry,'\x01');
        }
        fmt = "The %s is encrypted, but currently not supported";
        goto LAB_0016ef35;
      }
      uVar12 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar12 < uVar1);
  }
  if (zip->has_encrypted_entries == -1) {
    zip->has_encrypted_entries = 0;
  }
  if (1 < iVar9 || iVar9 == 0 && 2 < uVar1) {
    fmt = "The %s is encoded with many filters, but currently not supported";
LAB_0016ef35:
    archive_set_error(&a->archive,-1,fmt,pcVar15);
    return -0x1e;
  }
  coder1 = folder->coders;
  p_Var13 = coder1 + 1;
  coder2 = (_7z_coder *)0x0;
  if (uVar1 == 2) {
    coder2 = p_Var13;
  }
  if (iVar9 == 0) goto LAB_0016f305;
  local_48[2] = &setup_decode_folder::coder_copy;
  local_48[0] = &setup_decode_folder::coder_copy;
  local_48[1] = &setup_decode_folder::coder_copy;
  local_d8[2] = (void *)0x0;
  local_d8[0] = (void *)0x0;
  local_d8[1] = (void *)0x0;
  local_68._0_4_ = 0xffffffff;
  local_68._4_4_ = 0xffffffff;
  uStack_60 = 0xffffffffffffffff;
  local_58 = 0xffffffffffffffff;
  local_88[2] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_b8[0] = 0;
  local_b8[1] = 1;
  local_b8[2] = 2;
  local_98 = coder2;
  if (((uVar1 == 4) && (coder1[3].codec == 0x303011b)) &&
     ((folder->numInStreams == 7 && (uVar10 == 4 && folder->numOutStreams == 4)))) {
    if (folder->bindPairs->inIndex == 5) {
      local_b8[0] = 1;
      local_b8[1] = 2;
      local_b8[2] = 0;
      uStack_60 = folder->unPackSize[1];
      local_58 = *folder->unPackSize;
      local_48[1] = p_Var13;
      local_48[2] = coder1;
LAB_0016f05d:
      p_Var13 = coder1 + 2;
    }
    else if (coder1->codec == 0) {
      if (p_Var13->codec == 0) goto LAB_0016f05d;
      if (coder1[2].codec != 0) goto LAB_0016f2c8;
    }
    else {
LAB_0016f2c8:
      if ((p_Var13->codec != 0) || (p_Var13 = coder1, coder1[2].codec != 0)) goto LAB_0016f2dd;
    }
    local_98 = coder1 + 3;
    psVar7 = folder->unPackSize + 2;
    coder1 = p_Var13;
LAB_0016f0b7:
    zip->main_stream_bytes_remaining = *psVar7;
    uVar11 = seek_pack(a);
    if ((int)uVar11 < 0) {
      bVar4 = false;
    }
    else {
      zip->pack_stream_bytes_unconsumed = zip->pack_stream_inbytes_remaining;
      local_a8 = coder1;
      read_consume(a);
      lVar14 = 0;
      local_a0 = a;
      do {
        local_c0 = local_48[lVar14];
        uVar11 = seek_pack(a);
        if ((int)uVar11 < 0) {
          free(local_d8[0]);
          free(local_d8[1]);
          free(local_d8[2]);
          bVar4 = false;
          uVar10 = uVar11;
        }
        else {
          uVar6 = (&local_68)[lVar14];
          if (uVar6 == 0xffffffffffffffff) {
            uVar6 = zip->pack_stream_inbytes_remaining;
          }
          zip->folder_outbytes_remaining = uVar6;
          iVar9 = init_decompression(a,zip,local_c0,(_7z_coder *)0x0);
          if (iVar9 == 0) {
            local_c0 = (_7z_coder *)malloc(zip->folder_outbytes_remaining);
            local_d8[lVar14] = local_c0;
            if (local_c0 == (_7z_coder *)0x0) {
              free(local_d8[0]);
              free(local_d8[1]);
              free(local_d8[2]);
              archive_set_error(&a->archive,0xc,"No memory for 7-Zip decompression");
              bVar4 = false;
              uVar10 = 0xffffffe2;
            }
            else {
              while (zip->pack_stream_inbytes_remaining != 0) {
                __n = extract_pack_stream(a,0);
                if (((long)__n < 0) ||
                   (__n = get_uncompressed_data
                                    (a,&local_90,zip->uncompressed_buffer_bytes_remaining,0),
                   (long)__n < 0)) {
                  free(local_d8[0]);
                  free(local_d8[1]);
                  free(local_d8[2]);
                  bVar4 = false;
                  uVar10 = (uint)__n;
                  goto LAB_0016f187;
                }
                sVar3 = local_88[lVar14];
                memcpy((void *)((long)&local_c0->codec + sVar3),local_90,__n);
                a = local_a0;
                local_88[lVar14] = __n + sVar3;
                if (zip->pack_stream_bytes_unconsumed != 0) {
                  read_consume(local_a0);
                }
              }
              bVar4 = true;
            }
          }
          else {
            free(local_d8[0]);
            free(local_d8[1]);
            free(local_d8[2]);
            bVar4 = false;
            uVar10 = 0xffffffe2;
          }
        }
LAB_0016f187:
        coder1 = local_a8;
        uVar11 = uVar10;
        if (!bVar4) {
          bVar4 = false;
          goto LAB_0016f2fb;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      lVar14 = 0;
      do {
        iVar9 = local_b8[lVar14];
        zip->sub_stream_buff[lVar14] = (uchar *)local_d8[iVar9];
        sVar3 = local_88[iVar9];
        zip->sub_stream_size[lVar14] = sVar3;
        zip->sub_stream_bytes_remaining[lVar14] = sVar3;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      if (zip->tmp_stream_buff == (uchar *)0x0) {
        zip->tmp_stream_buff_size = 0x8000;
        puVar8 = (uchar *)malloc(0x8000);
        zip->tmp_stream_buff = puVar8;
        if (puVar8 == (uchar *)0x0) {
          pcVar15 = "No memory for 7-Zip decompression";
          iVar9 = 0xc;
          goto LAB_0016f2ef;
        }
      }
      zip->odd_bcj_size = 0;
      zip->bcj2_outPos = 0;
      zip->tmp_stream_bytes_avail = 0;
      zip->tmp_stream_bytes_remaining = 0;
      zip->pack_stream_remaining = 1;
      zip->pack_stream_index = folder->packIndex;
      uVar6 = folder_uncompressed_size(folder);
      zip->folder_outbytes_remaining = uVar6;
      zip->uncompressed_buffer_bytes_remaining = 0;
      bVar4 = true;
      a = local_a0;
    }
  }
  else {
    if (((uVar1 == 2) && (uVar10 == 4 && coder2->codec == 0x303011b)) &&
       ((folder->numInStreams == 5 && (folder->numOutStreams == 2)))) {
      psVar7 = folder->unPackSize;
      goto LAB_0016f0b7;
    }
LAB_0016f2dd:
    pcVar15 = "Unsupported form of BCJ2 streams";
    iVar9 = -1;
LAB_0016f2ef:
    bVar4 = false;
    archive_set_error(&a->archive,iVar9,pcVar15);
    uVar11 = 0xffffffe2;
  }
LAB_0016f2fb:
  coder2 = local_98;
  if (!bVar4) {
    return uVar11;
  }
LAB_0016f305:
  iVar5 = init_decompression(a,zip,coder1,coder2);
  iVar9 = -0x1e;
  if (iVar5 == 0) {
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int
setup_decode_folder(struct archive_read *a, struct _7z_folder *folder,
    int header)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const struct _7z_coder *coder1, *coder2;
	const char *cname = (header)?"archive header":"file content";
	unsigned i;
	int r, found_bcj2 = 0;

	/*
	 * Release the memory which the previous folder used for BCJ2.
	 */
	for (i = 0; i < 3; i++) {
		free(zip->sub_stream_buff[i]);
		zip->sub_stream_buff[i] = NULL;
	}

	/*
	 * Initialize a stream reader.
	 */
	zip->pack_stream_remaining = (unsigned)folder->numPackedStreams;
	zip->pack_stream_index = (unsigned)folder->packIndex;
	zip->folder_outbytes_remaining = folder_uncompressed_size(folder);
	zip->uncompressed_buffer_bytes_remaining = 0;

	/*
	 * Check coder types.
	 */
	for (i = 0; i < folder->numCoders; i++) {
		switch(folder->coders[i].codec) {
			case _7Z_CRYPTO_MAIN_ZIP:
			case _7Z_CRYPTO_RAR_29:
			case _7Z_CRYPTO_AES_256_SHA_256: {
				/* For entry that is associated with this folder, mark
				   it as encrypted (data+metadata). */
				zip->has_encrypted_entries = 1;
				if (a->entry) {
					archive_entry_set_is_data_encrypted(a->entry, 1);
					archive_entry_set_is_metadata_encrypted(a->entry, 1);
				}
				archive_set_error(&(a->archive),
					ARCHIVE_ERRNO_MISC,
					"The %s is encrypted, "
					"but currently not supported", cname);
				return (ARCHIVE_FATAL);
			}
			case _7Z_X86_BCJ2: {
				found_bcj2++;
				break;
			}
		}
	}
	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if ((folder->numCoders > 2 && !found_bcj2) || found_bcj2 > 1) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC,
		    "The %s is encoded with many filters, "
		    "but currently not supported", cname);
		return (ARCHIVE_FATAL);
	}
	coder1 = &(folder->coders[0]);
	if (folder->numCoders == 2)
		coder2 = &(folder->coders[1]);
	else
		coder2 = NULL;

	if (found_bcj2) {
		/*
		 * Preparation to decode BCJ2.
		 * Decoding BCJ2 requires four sources. Those are at least,
		 * as far as I know, two types of the storage form.
		 */
		const struct _7z_coder *fc = folder->coders;
		static const struct _7z_coder coder_copy = {0, 1, 1, 0, NULL};
		const struct _7z_coder *scoder[3] =
			{&coder_copy, &coder_copy, &coder_copy};
		const void *buff;
		ssize_t bytes;
		unsigned char *b[3] = {NULL, NULL, NULL};
		uint64_t sunpack[3] ={-1, -1, -1};
		size_t s[3] = {0, 0, 0};
		int idx[3] = {0, 1, 2};

		if (folder->numCoders == 4 && fc[3].codec == _7Z_X86_BCJ2 &&
		    folder->numInStreams == 7 && folder->numOutStreams == 4 &&
		    zip->pack_stream_remaining == 4) {
			/* Source type 1 made by 7zr or 7z with -m options. */
			if (folder->bindPairs[0].inIndex == 5) {
				/* The form made by 7zr */
				idx[0] = 1; idx[1] = 2; idx[2] = 0;
				scoder[1] = &(fc[1]);
				scoder[2] = &(fc[0]);
				sunpack[1] = folder->unPackSize[1];
				sunpack[2] = folder->unPackSize[0];
				coder1 = &(fc[2]);
			} else {
				/*
				 * NOTE: Some patterns do not work.
				 * work:
				 *  7z a -m0=BCJ2 -m1=COPY -m2=COPY
				 *       -m3=(any)
				 *  7z a -m0=BCJ2 -m1=COPY -m2=(any)
				 *       -m3=COPY
				 *  7z a -m0=BCJ2 -m1=(any) -m2=COPY
				 *       -m3=COPY
				 * not work:
				 *  other patterns.
				 *
				 * We have to handle this like `pipe' or
				 * our libarchive7s filter frame work,
				 * decoding the BCJ2 main stream sequentially,
				 * m3 -> m2 -> m1 -> BCJ2.
				 *
				 */
				if (fc[0].codec == _7Z_COPY &&
				    fc[1].codec == _7Z_COPY)
					coder1 = &(folder->coders[2]);
				else if (fc[0].codec == _7Z_COPY &&
				    fc[2].codec == _7Z_COPY)
					coder1 = &(folder->coders[1]);
				else if (fc[1].codec == _7Z_COPY &&
				    fc[2].codec == _7Z_COPY)
					coder1 = &(folder->coders[0]);
				else {
					archive_set_error(&(a->archive),
					    ARCHIVE_ERRNO_MISC,
					    "Unsupported form of "
					    "BCJ2 streams");
					return (ARCHIVE_FATAL);
				}
			}
			coder2 = &(fc[3]);
			zip->main_stream_bytes_remaining =
				(size_t)folder->unPackSize[2];
		} else if (coder2 != NULL && coder2->codec == _7Z_X86_BCJ2 &&
		    zip->pack_stream_remaining == 4 &&
		    folder->numInStreams == 5 && folder->numOutStreams == 2) {
			/* Source type 0 made by 7z */
			zip->main_stream_bytes_remaining =
				(size_t)folder->unPackSize[0];
		} else {
			/* We got an unexpected form. */
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unsupported form of BCJ2 streams");
			return (ARCHIVE_FATAL);
		}

		/* Skip the main stream at this time. */
		if ((r = seek_pack(a)) < 0)
			return (r);
		zip->pack_stream_bytes_unconsumed =
		    (size_t)zip->pack_stream_inbytes_remaining;
		read_consume(a);

		/* Read following three sub streams. */
		for (i = 0; i < 3; i++) {
			const struct _7z_coder *coder = scoder[i];

			if ((r = seek_pack(a)) < 0) {
				free(b[0]); free(b[1]); free(b[2]);
				return (r);
			}

			if (sunpack[i] == (uint64_t)-1)
				zip->folder_outbytes_remaining =
				    zip->pack_stream_inbytes_remaining;
			else
				zip->folder_outbytes_remaining = sunpack[i];

			r = init_decompression(a, zip, coder, NULL);
			if (r != ARCHIVE_OK) {
				free(b[0]); free(b[1]); free(b[2]);
				return (ARCHIVE_FATAL);
			}

			/* Allocate memory for the decoded data of a sub
			 * stream. */
			b[i] = malloc((size_t)zip->folder_outbytes_remaining);
			if (b[i] == NULL) {
				free(b[0]); free(b[1]); free(b[2]);
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}

			/* Extract a sub stream. */
			while (zip->pack_stream_inbytes_remaining > 0) {
				r = (int)extract_pack_stream(a, 0);
				if (r < 0) {
					free(b[0]); free(b[1]); free(b[2]);
					return (r);
				}
				bytes = get_uncompressed_data(a, &buff,
				    zip->uncompressed_buffer_bytes_remaining,
				    0);
				if (bytes < 0) {
					free(b[0]); free(b[1]); free(b[2]);
					return ((int)bytes);
				}
				memcpy(b[i]+s[i], buff, bytes);
				s[i] += bytes;
				if (zip->pack_stream_bytes_unconsumed)
					read_consume(a);
			}
		}

		/* Set the sub streams to the right place. */
		for (i = 0; i < 3; i++) {
			zip->sub_stream_buff[i] = b[idx[i]];
			zip->sub_stream_size[i] = s[idx[i]];
			zip->sub_stream_bytes_remaining[i] = s[idx[i]];
		}

		/* Allocate memory used for decoded main stream bytes. */
		if (zip->tmp_stream_buff == NULL) {
			zip->tmp_stream_buff_size = 32 * 1024;
			zip->tmp_stream_buff =
			    malloc(zip->tmp_stream_buff_size);
			if (zip->tmp_stream_buff == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
		}
		zip->tmp_stream_bytes_avail = 0;
		zip->tmp_stream_bytes_remaining = 0;
		zip->odd_bcj_size = 0;
		zip->bcj2_outPos = 0;

		/*
		 * Reset a stream reader in order to read the main stream
		 * of BCJ2.
		 */
		zip->pack_stream_remaining = 1;
		zip->pack_stream_index = (unsigned)folder->packIndex;
		zip->folder_outbytes_remaining =
		    folder_uncompressed_size(folder);
		zip->uncompressed_buffer_bytes_remaining = 0;
	}

	/*
	 * Initialize the decompressor for the new folder's pack streams.
	 */
	r = init_decompression(a, zip, coder1, coder2);
	if (r != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}